

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigslot.hpp
# Opt level: O3

int __thiscall
utils::sigslot<void_(float,_float)>::connect
          (sigslot<void_(float,_float)> *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  _Node *p_Var2;
  undefined8 uVar3;
  undefined4 in_register_00000034;
  list<std::shared_ptr<utils::detail::slot<void(float,float)>>,std::allocator<std::shared_ptr<utils::detail::slot<void(float,float)>>>>
  *this_00;
  shared_ptr<utils::detail::slot<void_(float,_float)>_> s;
  undefined1 local_31;
  shared_ptr<utils::detail::slot<void_(float,_float)>_> local_30;
  
  this_00 = (list<std::shared_ptr<utils::detail::slot<void(float,float)>>,std::allocator<std::shared_ptr<utils::detail::slot<void(float,float)>>>>
             *)CONCAT44(in_register_00000034,__fd);
  __mutex = (pthread_mutex_t *)(this_00 + 0x18);
  iVar1 = pthread_mutex_lock(__mutex);
  if (iVar1 != 0) {
    uVar3 = std::__throw_system_error(iVar1);
    if (local_30.
        super___shared_ptr<utils::detail::slot<void_(float,_float)>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_30.
                 super___shared_ptr<utils::detail::slot<void_(float,_float)>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    pthread_mutex_unlock(__mutex);
    _Unwind_Resume(uVar3);
  }
  local_30.super___shared_ptr<utils::detail::slot<void_(float,_float)>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<utils::detail::slot<void(float,float)>,std::allocator<utils::detail::slot<void(float,float)>>,utils::detail::slot<void(float,float)>const&>
            (&local_30.
              super___shared_ptr<utils::detail::slot<void_(float,_float)>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,(slot<void_(float,_float)> **)&local_30,
             (allocator<utils::detail::slot<void_(float,_float)>_> *)&local_31,
             (slot<void_(float,_float)> *)__addr);
  p_Var2 = std::__cxx11::
           list<std::shared_ptr<utils::detail::slot<void(float,float)>>,std::allocator<std::shared_ptr<utils::detail::slot<void(float,float)>>>>
           ::_M_create_node<std::shared_ptr<utils::detail::slot<void(float,float)>>const&>
                     (this_00,&local_30);
  std::__detail::_List_node_base::_M_hook(&p_Var2->super__List_node_base);
  *(long *)(this_00 + 0x10) = *(long *)(this_00 + 0x10) + 1;
  (this->m_slots).
  super__List_base<std::shared_ptr<utils::detail::slot<void_(float,_float)>_>,_std::allocator<std::shared_ptr<utils::detail::slot<void_(float,_float)>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next =
       (_List_node_base *)
       local_30.
       super___shared_ptr<utils::detail::slot<void_(float,_float)>,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  (this->m_slots).
  super__List_base<std::shared_ptr<utils::detail::slot<void_(float,_float)>_>,_std::allocator<std::shared_ptr<utils::detail::slot<void_(float,_float)>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       (_List_node_base *)
       local_30.
       super___shared_ptr<utils::detail::slot<void_(float,_float)>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_30.
      super___shared_ptr<utils::detail::slot<void_(float,_float)>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_30.
       super___shared_ptr<utils::detail::slot<void_(float,_float)>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_weak_count =
           (local_30.
            super___shared_ptr<utils::detail::slot<void_(float,_float)>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_weak_count + 1;
      UNLOCK();
      if (local_30.
          super___shared_ptr<utils::detail::slot<void_(float,_float)>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
      goto LAB_00108311;
    }
    else {
      (local_30.
       super___shared_ptr<utils::detail::slot<void_(float,_float)>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_weak_count =
           (local_30.
            super___shared_ptr<utils::detail::slot<void_(float,_float)>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_weak_count + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.
               super___shared_ptr<utils::detail::slot<void_(float,_float)>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
LAB_00108311:
  pthread_mutex_unlock(__mutex);
  return (int)this;
}

Assistant:

SlotID connect(SlotType const &slot)
    {
        std::lock_guard<std::mutex> guard(m_mutex);
        auto const s = std::make_shared<SlotType>(slot);
        m_slots.push_back(s);
        return s;
    }